

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::DefaultInstanceType_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  string local_40;
  Descriptor *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_20 = descriptor;
  options_local = (Options *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  ClassName_abi_cxx11_(&local_40,this,descriptor);
  std::operator+(__return_storage_ptr__,&local_40,"DefaultTypeInternal");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultInstanceType(const Descriptor* descriptor,
                                const Options& options) {
  return ClassName(descriptor) + "DefaultTypeInternal";
}